

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  long *plVar2;
  typeOfCode type;
  typeOfCode type_00;
  typeOfCode type_01;
  typeOfCode type_02;
  typeOfCode type_03;
  typeOfCode type_04;
  typeOfCode type_05;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  BMP file;
  ofstream out;
  char local_6b5;
  longdouble local_6b4;
  longdouble local_6a8;
  longdouble local_69c;
  long local_690;
  long local_688;
  long local_680;
  BMP local_678;
  long local_208;
  filebuf local_200 [240];
  ios_base local_110 [264];
  
  setlocale(6,"RUS");
  BMP::BMP(&local_678,"D:\\Git\\INF\\src8.bmp");
  std::ofstream::ofstream(&local_208,"D:\\Git\\INF\\output.txt",_S_out);
  BMP::writeInfo(&local_678,(ofstream *)0x0);
  BMP::writeMatrix(&local_678,(ofstream *)0x0);
  BMP::writeFrequency(&local_678,(ofstream *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nEntropy: ",10);
  lVar3 = in_ST6;
  BMP::getEntropy(&local_678);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  BMP::writeCodesOfMessage(&local_678,HUFFMAN,(ofstream *)0x0);
  BMP::writeCodesOfMessage(&local_678,UNIFORM,(ofstream *)0x0);
  BMP::writeCodesOfMessage(&local_678,SHANNON,(ofstream *)0x0);
  BMP::writeCodesOfSymbols(&local_678,HUFFMAN,(ofstream *)0x0);
  BMP::writeCodesOfSymbols(&local_678,UNIFORM,(ofstream *)0x0);
  BMP::writeCodesOfSymbols(&local_678,SHANNON,(ofstream *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Size Uniform Codes: ",0x14);
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x0,type);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Size Code Shannon:  ",0x14);
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x2,type_00);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Size Code Huffman:  ",0x14);
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x1,type_01);
  poVar1 = std::ostream::_M_insert<long_double>(in_ST3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio Shannon\'s code: ",0x22);
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x0,type_02);
  local_6b4 = in_ST4;
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x2,type_03);
  poVar1 = std::ostream::_M_insert<long_double>(local_6b4 / in_ST5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Compression ratio Huffman\'s code: ",0x22);
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x0,type_04);
  local_6b4 = in_ST6;
  BMP::byteSizeCode((longdouble *)&local_678,(BMP *)0x1,type_05);
  poVar1 = std::ostream::_M_insert<long_double>(local_6b4 / lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_680 = BMP::sizeCode(&local_678,UNIFORM);
  local_6b4 = (longdouble)local_680;
  local_688 = BMP::sizeCode(&local_678,SHANNON);
  local_69c = (longdouble)local_688;
  local_690 = BMP::sizeCode(&local_678,HUFFMAN);
  local_6a8 = (longdouble)local_690;
  poVar1 = std::ostream::_M_insert<long_double>(local_6b4);
  local_6b5 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_6b5,1);
  poVar1 = std::ostream::_M_insert<long_double>(local_69c);
  local_6b5 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_6b5,1);
  poVar1 = std::ostream::_M_insert<long_double>(local_6a8);
  local_6b5 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_6b5,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Redundancy Shannon\'s code: ",0x1b);
  poVar1 = std::ostream::_M_insert<long_double>((local_6b4 - local_69c) / local_69c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Redundancy Huffman\'s code: ",0x1b);
  poVar1 = std::ostream::_M_insert<long_double>((local_6b4 - local_6a8) / local_6a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::ofstream::close();
  local_208 = _VTT;
  *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  BMP::~BMP(&local_678);
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "RUS");
    BMP file( (char *)"D:\\Git\\INF\\src8.bmp" );
    ofstream out("D:\\Git\\INF\\output.txt");
    file.writeInfo();
    file.writeMatrix();
    file.writeFrequency();
    cout << "\nEntropy: " << file.getEntropy() << endl;
    file.writeCodesOfMessage(HUFFMAN);
    file.writeCodesOfMessage(UNIFORM);
    file.writeCodesOfMessage(SHANNON);
    file.writeCodesOfSymbols(HUFFMAN);
    file.writeCodesOfSymbols(UNIFORM);
    file.writeCodesOfSymbols(SHANNON);
    cout << "Size Uniform Codes: " << file.byteSizeCode(UNIFORM)<< endl;
    cout << "Size Code Shannon:  " << file.byteSizeCode(SHANNON)<< endl;
    cout << "Size Code Huffman:  " << file.byteSizeCode(HUFFMAN)<< endl << endl;
	cout << "Compression ratio Shannon's code: " << file.byteSizeCode(UNIFORM) / file.byteSizeCode(SHANNON) << endl;
	cout << "Compression ratio Huffman's code: " << file.byteSizeCode(UNIFORM) / file.byteSizeCode(HUFFMAN) << endl;
    long double shannonSize, huffmanSize, uniformSize;
    uniformSize = file.sizeCode(UNIFORM);
    shannonSize = file.sizeCode(SHANNON);
    huffmanSize = file.sizeCode(HUFFMAN);
    cout << uniformSize << ' ' << shannonSize << ' ' << huffmanSize << '\n';
    cout << "Redundancy Shannon's code: " << (uniformSize-shannonSize)/shannonSize << endl;
    cout << "Redundancy Huffman's code: " << (uniformSize-huffmanSize)/huffmanSize << endl;
    out.close();
    //system("pause>>null");
    return 0;
}